

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_std.h
# Opt level: O2

double __thiscall
mp::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
          (mp *this,QuadraticObjective *obj,
          VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x)

{
  VarInfoImpl<std::vector<double,_std::allocator<double>_>_> *x_00;
  longdouble in_ST0;
  longdouble in_ST1;
  double dVar1;
  
  LinTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
            ((longdouble *)(this + 8),(LinTerms *)obj,x);
  QuadTerms::ComputeValue<mp::VarInfoImpl<std::vector<double,std::allocator<double>>>>
            ((longdouble *)(this + 0xa8),(QuadTerms *)obj,x_00);
  if ((long)*(int *)(this + 0xa0) < 0) {
    dVar1 = 0.0;
  }
  else {
    dVar1 = *(double *)
             (*(size_ty *)
               ((long)&(obj->super_NLObjective).super_LinearObjective.lt_.coefs_.
                       super_small_vector_base<std::allocator<double>,_6U>.m_data.
                       super_small_vector_data_base<double_*,_unsigned_long> + 8) +
             (long)*(int *)(this + 0xa0) * 8);
  }
  return (double)in_ST0 + (double)in_ST1 + dVar1;
}

Assistant:

double ComputeValue(
    const QuadraticObjective& obj, const VarVec& x) {
  double linp = obj.GetLinTerms().ComputeValue(x);
  double qp = obj.GetQPTerms().ComputeValue(x);
  double nlp = (obj.HasExpr() ? x[obj.ExprIndex()] : 0.0);
  return linp + qp + nlp;
}